

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  ostream *poVar1;
  char *this_00;
  GeometryShaderInvalidArrayedInputVariablesTest *this_01;
  stringstream code_sstream;
  string sStack_1c8;
  undefined1 local_1a8 [392];
  
  this_01 = (GeometryShaderInvalidArrayedInputVariablesTest *)local_1a8;
  std::__cxx11::stringstream::stringstream((stringstream *)this_01);
  getValidInputVariableArraySize(this_01,gs_input_primitive_type);
  this_00 = "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (";
  poVar1 = std::operator<<((ostream *)(local_1a8 + 0x10),
                           "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (");
  getInputPrimitiveTypeQualifier_abi_cxx11_
            (&sStack_1c8,(GeometryShaderInvalidArrayedInputVariablesTest *)this_00,
             gs_input_primitive_type);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1c8);
  poVar1 = std::operator<<(poVar1,") in;\nlayout (points, max_vertices = 1) out;\n\nin vec4 data[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"];\n\nvoid main()\n{\n    gl_Position = data[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"];\n    EmitVertex();\n}\n");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getGSCode(glw::GLenum gs_input_primitive_type) const
{
	std::stringstream  code_sstream;
	const unsigned int valid_array_size = getValidInputVariableArraySize(gs_input_primitive_type);

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout ("
				 << getInputPrimitiveTypeQualifier(gs_input_primitive_type)
				 << ") in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"in vec4 data["
				 << (valid_array_size + 1) << "];\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    gl_Position = data["
				 << valid_array_size << "];\n"
										"    EmitVertex();\n"
										"}\n";

	return code_sstream.str();
}